

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InitialValueCase::iterate(InitialValueCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  GLenum err;
  undefined4 extraout_var;
  char *description;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  CallLogWrapper gl;
  Array<float_*> local_208;
  StateQueryMemoryWriteGuard<float[8]> state;
  MessageBuilder local_198;
  
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::StateQueryMemoryWriteGuard(&state);
  iVar18 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar18),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  gl.m_enableLog = true;
  local_198.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Querying GL_PRIMITIVE_BOUNDING_BOX_EXT, expecting (-1, -1, -1, 1) (1, 1, 1, 1)");
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  glu::CallLogWrapper::glGetFloatv(&gl,0x92be,state.m_value);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xbe);
  bVar17 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                     (&state,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if (bVar17) {
    local_198.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_198.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Got ");
    local_208.end = state.m_postguard;
    local_208.begin = state.m_value;
    tcu::Format::operator<<((ostream *)poVar1,&local_208);
    tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    auVar19._4_4_ = -(uint)(state.m_value[1] != -1.0);
    auVar19._0_4_ = -(uint)(state.m_value[0] != -1.0);
    auVar19._8_4_ = -(uint)(state.m_value[2] != -1.0);
    auVar19._12_4_ = -(uint)(state.m_value[3] != 1.0);
    auVar20._4_4_ = -(uint)(state.m_value[5] != 1.0);
    auVar20._0_4_ = -(uint)(state.m_value[4] != 1.0);
    auVar20._8_4_ = -(uint)(state.m_value[6] != 1.0);
    auVar20._12_4_ = -(uint)(state.m_value[7] != 1.0);
    auVar20 = packssdw(auVar19,auVar20);
    bVar15 = (auVar20 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar16 = (auVar20 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar14 = (auVar20 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar13 = (auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar12 = (auVar20 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar11 = (auVar20 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar10 = (auVar20 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar9 = (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar8 = (auVar20 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar7 = (auVar20 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar6 = (auVar20 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar5 = (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar4 = (auVar20 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar3 = (auVar20 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar2 = (auVar20 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    bVar17 = -1 < auVar20[0xf];
    if (((((((((((((((bVar15 && bVar16) && bVar14) && bVar13) && bVar12) && bVar11) && bVar10) &&
               bVar9) && bVar8) && bVar7) && bVar6) && bVar5) && bVar4) && bVar3) && bVar2) &&
        bVar17) {
      description = "Pass";
    }
    else {
      local_198.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_198.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Error, unexpected value");
      tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      description = "Invalid initial value";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(((((((((((((((!bVar15 || !bVar16) || !bVar14) || !bVar13) || !bVar12) ||
                               !bVar11) || !bVar10) || !bVar9) || !bVar8) || !bVar7) || !bVar6) ||
                         !bVar5) || !bVar4) || !bVar3) || !bVar2) || !bVar17),description);
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

InitialValueCase::IterateResult InitialValueCase::iterate (void)
{
	StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLfloat[8]>	state;
	glu::CallLogWrapper											gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	gl.enableLogging(true);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Querying GL_PRIMITIVE_BOUNDING_BOX_EXT, expecting (-1, -1, -1, 1) (1, 1, 1, 1)"
		<< tcu::TestLog::EndMessage;

	gl.glGetFloatv(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

	if (!state.verifyValidity(m_testCtx))
		return STOP;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Got " << tcu::formatArray(&state[0], &state[8])
		<< tcu::TestLog::EndMessage;

	if ((state[0] != -1.0f) || (state[1] != -1.0f) || (state[2] != -1.0f) || (state[3] != 1.0f) ||
		(state[4] !=  1.0f) || (state[5] !=  1.0f) || (state[6] !=  1.0f) || (state[7] != 1.0f))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Error, unexpected value"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid initial value");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}